

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  int savedFlags;
  sqlite3 *db;
  Table *pTab;
  Select *in_stack_00000040;
  Table *in_stack_00000048;
  Parse *in_stack_00000050;
  i16 *in_stack_00000058;
  ExprList *in_stack_00000060;
  Parse *in_stack_00000068;
  Table *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  long local_18;
  Table *local_8;
  
  lVar1 = *in_RDI;
  iVar2 = (int)*(undefined8 *)(lVar1 + 0x30);
  *(ulong *)(lVar1 + 0x30) = *(ulong *)(lVar1 + 0x30) & 0xfffffffffffffffb;
  *(ulong *)(lVar1 + 0x30) = *(ulong *)(lVar1 + 0x30) | 0x40;
  sqlite3SelectPrep((Parse *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                    (Select *)in_stack_ffffffffffffffc8,(NameContext *)0x1a6c2d);
  local_18 = in_RSI;
  if ((int)in_RDI[6] == 0) {
    for (; *(long *)(local_18 + 0x50) != 0; local_18 = *(long *)(local_18 + 0x50)) {
    }
    *(long *)(lVar1 + 0x30) = (long)iVar2;
    local_8 = (Table *)sqlite3DbMallocZero((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                                           (u64)in_stack_ffffffffffffffc8);
    if (local_8 == (Table *)0x0) {
      local_8 = (Table *)0x0;
    }
    else {
      local_8->nTabRef = 1;
      local_8->zName = (char *)0x0;
      local_8->nRowLogEst = 200;
      sqlite3ColumnsFromExprList
                (in_stack_00000068,in_stack_00000060,in_stack_00000058,(Column **)in_stack_00000050)
      ;
      sqlite3SelectAddColumnTypeAndCollation(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      local_8->iPKey = -1;
      if (*(char *)(lVar1 + 0x61) != '\0') {
        sqlite3DeleteTable((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8);
        local_8 = (Table *)0x0;
      }
    }
  }
  else {
    local_8 = (Table *)0x0;
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect){
  Table *pTab;
  sqlite3 *db = pParse->db;
  int savedFlags;

  savedFlags = db->flags;
  db->flags &= ~SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  db->flags = savedFlags;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  /* The sqlite3ResultSetOfSelect() is only used n contexts where lookaside
  ** is disabled */
  assert( db->lookaside.bDisable );
  pTab->nTabRef = 1;
  pTab->zName = 0;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  sqlite3ColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSelect);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}